

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

pos_type gimage::anon_unknown_11::readPNMHeader
                   (char *name,int *ncomp,long *maxval,float *scale,long *width,long *height)

{
  double dVar1;
  bool bVar2;
  _Ios_Iostate __a;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  ostream *message;
  ostream *poVar7;
  float *in_RCX;
  long *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  long *in_R8;
  long *in_R9;
  failure *ex;
  ostringstream ss;
  ifstream in;
  string s;
  pos_type ret;
  char *in_stack_fffffffffffff9d8;
  fpos<__mbstate_t> *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e8;
  string *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa28;
  ostringstream local_500 [120];
  istream *in_stack_fffffffffffffb78;
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [39];
  undefined1 local_301;
  string local_2a0 [32];
  long local_280 [67];
  string local_68 [32];
  long *local_48;
  long *local_40;
  float *local_38;
  long *local_30;
  undefined4 *local_28;
  char *local_20;
  pos_type local_18;
  
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  std::__cxx11::string::string(local_68);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff9e0,(streamoff)in_stack_fffffffffffff9d8);
  std::ifstream::ifstream(local_280);
  uVar3 = *(undefined8 *)(local_280[0] + -0x18);
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((int)local_280 + (int)uVar3);
  std::ifstream::open((char *)local_280,(_Ios_Openmode)local_20);
  (anonymous_namespace)::readPNMToken_abi_cxx11_(in_stack_fffffffffffffb78);
  std::__cxx11::string::operator=(local_68,local_2a0);
  std::__cxx11::string::~string(local_2a0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  if (bVar2) {
LAB_0013a5d3:
    *local_28 = 1;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    if (bVar2) goto LAB_0013a5d3;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      if (!bVar2) {
        local_301 = 1;
        uVar3 = __cxa_allocate_exception(0x28);
        std::operator+(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
        std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
        std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
        gutil::IOException::IOException
                  ((IOException *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        local_301 = 0;
        __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
      }
    }
    *local_28 = 3;
  }
  (anonymous_namespace)::readPNMToken_abi_cxx11_(in_stack_fffffffffffffb78);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  lVar5 = atol(pcVar4);
  *local_40 = lVar5;
  std::__cxx11::string::~string(local_328);
  (anonymous_namespace)::readPNMToken_abi_cxx11_(in_stack_fffffffffffffb78);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  lVar5 = atol(pcVar4);
  *local_48 = lVar5;
  std::__cxx11::string::~string(local_348);
  *local_30 = 0;
  *local_38 = 0.0;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    if (!bVar2) {
      (anonymous_namespace)::readPNMToken_abi_cxx11_(in_stack_fffffffffffffb78);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      lVar5 = atol(pcVar4);
      *local_30 = lVar5;
      std::__cxx11::string::~string(local_388);
      goto LAB_0013a97e;
    }
  }
  (anonymous_namespace)::readPNMToken_abi_cxx11_(in_stack_fffffffffffffb78);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar4);
  *local_38 = (float)dVar1;
  std::__cxx11::string::~string(local_368);
LAB_0013a97e:
  if (((*local_40 != 0) && (*local_48 != 0)) &&
     ((*local_30 != 0 || ((*local_38 != 0.0 || (NAN(*local_38))))))) {
    local_18 = (pos_type)std::istream::tellg();
    std::ifstream::close();
    std::ifstream::~ifstream(local_280);
    std::__cxx11::string::~string(local_68);
    return local_18;
  }
  std::__cxx11::ostringstream::ostringstream(local_500);
  poVar6 = std::operator<<((ostream *)local_500,"Invalid PNM image (");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_40);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_48);
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<(poVar6,*local_30);
  message = std::operator<<((ostream *)local_500," ");
  poVar7 = (ostream *)std::ostream::operator<<(message,*local_38);
  poVar7 = std::operator<<(poVar7,") of image ");
  std::operator<<(poVar7,local_20);
  uVar3 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  gutil::IOException::IOException((IOException *)poVar6,(string *)message);
  __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

std::istream::pos_type readPNMHeader(const char *name, int &ncomp, long &maxval,
                                     float &scale, long &width, long &height)
{
  std::string            s;
  std::istream::pos_type ret=0;

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    s=readPNMToken(in);

    if (s == "P5" || s == "Pf")
    {
      ncomp=1;
    }
    else if (s == "P6" || s == "PF")
    {
      ncomp=3;
    }
    else
    {
      throw gutil::IOException("Unknown PNM image type '"+s+"' of image "+name);
    }

    width=atol(readPNMToken(in).c_str());
    height=atol(readPNMToken(in).c_str());

    maxval=0;
    scale=0;

    if (s == "Pf" || s == "PF")
    {
      scale=static_cast<float>(atof(readPNMToken(in).c_str()));
    }
    else
    {
      maxval=atol(readPNMToken(in).c_str());
    }

    if (width == 0 || height == 0 || (maxval == 0 && scale== 0))
    {
      std::ostringstream ss;
      ss << "Invalid PNM image (" << width << " " << height << " " << maxval;
      ss << " " << scale << ") of image " << name;
      throw gutil::IOException(ss.str());
    }

    ret=in.tellg();
    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }

  return ret;
}